

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNSubdivPatch1BuilderSAH<4>::build(BVHNSubdivPatch1BuilderSAH<4> *this)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Settings settings;
  char cVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  NodeRef root;
  runtime_error *prVar13;
  size_t i_2;
  ulong uVar14;
  size_t *psVar15;
  ulong uVar16;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *pPVar17;
  size_t i_1;
  size_t sVar18;
  ulong uVar19;
  EVP_PKEY_CTX *ctx;
  ulong uVar20;
  BVHN<4> *pBVar21;
  size_t N;
  ulong uVar22;
  size_t i;
  size_t sVar23;
  ulong uVar24;
  bool bVar25;
  float fVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  float fVar35;
  undefined4 uVar36;
  float fVar37;
  undefined4 uVar38;
  float fVar39;
  undefined4 uVar40;
  float fVar41;
  undefined4 uVar42;
  float fVar43;
  anon_class_1_0_00000001 local_2e21;
  size_t taskCount;
  ulong *local_2e18;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_2e10;
  undefined1 local_2e08 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2df8;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  undefined8 local_2dd8;
  undefined8 uStack_2dd0;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  undefined1 local_2db8 [16];
  double local_2da0;
  anon_class_8_1_898bcfc2_conflict7 local_2d98;
  Iterator<embree::SubdivMesh,_false> *local_2d90;
  Iterator<embree::SubdivMesh,_false> iter;
  ProgressMonitorClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_subdiv_cpp:92:25)>
  virtualprogress;
  PrimInfo pinfo;
  PrimInfo pinfo3;
  undefined8 local_2c98;
  undefined8 uStack_2c90;
  undefined8 local_2c88;
  undefined8 uStack_2c80;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  size_t local_2c68;
  size_t sStack_2c60;
  undefined1 local_2c58 [16];
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  sVar18 = (this->scene->world).numSubdivPatches;
  if (sVar18 == 0) {
    if ((this->prims).size_active != 0) {
      (this->prims).size_active = 0;
    }
    (this->prims).size_active = 0;
    pBVar21 = this->bvh;
    pPVar17 = &pstate;
    goto LAB_005f237c;
  }
  pBVar21 = this->bvh;
  std::__cxx11::to_string((string *)&local_2df8.field_1,4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                 "sse2::BVH",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_2df8.field_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pstate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                 "SubdivPatch1BuilderSAH");
  local_2da0 = BVHN<4>::preBuild(pBVar21,(string *)&pstate);
  std::__cxx11::string::~string((string *)&pstate);
  std::__cxx11::string::~string((string *)&pinfo);
  std::__cxx11::string::~string((string *)&local_2df8.field_1);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar18 << 5);
  virtualprogress.super_BuildProgressMonitor._vptr_BuildProgressMonitor =
       (_func_int **)&PTR_operator___021e14c8;
  pstate.super_ParallelForForState.taskCount = 0;
  iter.scene = this->scene;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = &iter;
  iter.all = false;
  sVar18 = ((iter.scene)->geometries).size_active;
  uVar22 = 0;
  local_2e10 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
               this;
  virtualprogress.closure.this = this;
  for (sVar23 = 0; sVar18 != sVar23; sVar23 = sVar23 + 1) {
    sVar9 = ParallelForForState::init<embree::Scene::Iterator<embree::SubdivMesh,_false>_>::
            anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&pinfo,sVar23);
    uVar22 = uVar22 + sVar9;
  }
  pstate.super_ParallelForForState.N = uVar22;
  iVar8 = tbb::detail::d1::max_concurrency();
  uVar14 = uVar22 + 0x3ff >> 10;
  if ((ulong)(long)iVar8 < uVar14) {
    uVar14 = (long)iVar8;
  }
  uVar10 = 0x40;
  if (uVar14 < 0x40) {
    uVar10 = uVar14;
  }
  sVar18 = 0;
  pstate.super_ParallelForForState.taskCount = uVar10 + (uVar10 == 0);
  pstate.super_ParallelForForState.i0[0] = 0;
  pstate.super_ParallelForForState.j0[0] = 0;
  uVar10 = uVar22 / pstate.super_ParallelForForState.taskCount;
  uVar14 = 1;
  uVar24 = 0;
  while (sVar23 = pstate.super_ParallelForForState.taskCount,
        uVar14 < pstate.super_ParallelForForState.taskCount) {
    sVar23 = ParallelForForState::init<embree::Scene::Iterator<embree::SubdivMesh,_false>_>::
             anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&pinfo,sVar18);
    uVar19 = (uVar14 + 1) * uVar22;
    uVar20 = 0;
    uVar16 = uVar24;
    for (; ((uVar24 = (uVar16 + sVar23) - uVar20, uVar20 < sVar23 && (uVar10 <= uVar24)) &&
           (uVar14 < pstate.super_ParallelForForState.taskCount)); uVar14 = uVar14 + 1) {
      pstate.super_ParallelForForState.i0[uVar14] = sVar18;
      uVar20 = uVar20 + (uVar10 - uVar16);
      pstate.super_ParallelForForState.j0[uVar14] = uVar20;
      uVar24 = uVar19 / pstate.super_ParallelForForState.taskCount;
      uVar19 = uVar19 + uVar22;
      uVar16 = uVar10;
      uVar10 = uVar24;
    }
    sVar18 = sVar18 + 1;
  }
  local_2df8._0_8_ = 0x7f8000007f800000;
  local_2df8._8_8_ = 0x7f8000007f800000;
  local_2de8 = (anon_class_1_0_00000001 *)0xff800000ff800000;
  uStack_2de0 = (anon_class_16_2_341d598e_conflict1 *)0xff800000ff800000;
  local_2dd8 = (anon_class_1_0_00000001 *)0x7f8000007f800000;
  uStack_2dd0 = (anon_class_8_1_898bcfc2_conflict7 *)0x7f8000007f800000;
  local_2dc8 = 0xff800000ff800000;
  uStack_2dc0 = 0xff800000ff800000;
  local_2db8 = (undefined1  [16])0x0;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
       local_2e08 + 8;
  local_2e08._8_8_ = &iter;
  local_2c98 = (undefined **)local_2e08;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = &taskCount;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = &pstate;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = &local_2df8;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ = &local_2e21;
  taskCount = pstate.super_ParallelForForState.taskCount;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
       (anon_class_1_0_00000001 *)&local_2c98;
  uStack_2c90 = (Iterator<embree::SubdivMesh,_false> *)local_2e08._8_8_;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)&pinfo,(context_traits)0x4,CUSTOM_CTX);
  local_2d98.func = (anon_class_48_6_afa08d2e_conflict1 *)&pinfo3;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,sVar23,1,&local_2d98,(task_group_context *)&pinfo);
  cVar7 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&pinfo);
  pPVar17 = local_2e10;
  if (cVar7 != '\0') {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"task cancelled");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&pinfo);
  psVar15 = &pstate.prefix_state.sums[0].begin;
  sVar18 = taskCount;
  uVar27 = local_2df8.m128[0];
  uVar28 = local_2df8.m128[1];
  uVar29 = local_2df8.m128[2];
  uVar30 = local_2df8.m128[3];
  fVar26 = (float)local_2de8;
  uVar31 = local_2de8._4_4_;
  uVar32 = (undefined4)uStack_2de0;
  uVar33 = uStack_2de0._4_4_;
  fVar35 = (float)local_2dd8;
  fVar37 = local_2dd8._4_4_;
  fVar39 = (float)uStack_2dd0;
  fVar41 = uStack_2dd0._4_4_;
  fVar43 = (float)local_2dc8;
  uVar34 = local_2dc8._4_4_;
  uVar36 = (undefined4)uStack_2dc0;
  uVar38 = uStack_2dc0._4_4_;
  sVar23 = local_2db8._0_8_;
  uVar22 = local_2db8._8_8_;
  while (bVar25 = sVar18 != 0, sVar18 = sVar18 - 1, bVar25) {
    (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar15 + -8))->
    super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128[0] = (float)uVar27;
    *(undefined4 *)((long)psVar15 + -0x3c) = uVar28;
    *(undefined4 *)(psVar15 + -7) = uVar29;
    *(undefined4 *)((long)psVar15 + -0x34) = uVar30;
    (((Vec3fa *)(psVar15 + -6))->field_0).m128[0] = fVar26;
    *(undefined4 *)((long)psVar15 + -0x2c) = uVar31;
    *(undefined4 *)(psVar15 + -5) = uVar32;
    *(undefined4 *)((long)psVar15 + -0x24) = uVar33;
    (((BBox3fa *)(psVar15 + -4))->lower).field_0.m128[0] = fVar35;
    *(float *)((long)psVar15 + -0x1c) = fVar37;
    *(float *)(psVar15 + -3) = fVar39;
    *(float *)((long)psVar15 + -0x14) = fVar41;
    (((Vec3fa *)(psVar15 + -2))->field_0).m128[0] = fVar43;
    *(undefined4 *)((long)psVar15 + -0xc) = uVar34;
    *(undefined4 *)(psVar15 + -1) = uVar36;
    *(undefined4 *)((long)psVar15 + -4) = uVar38;
    *psVar15 = sVar23;
    psVar15[1] = uVar22;
    sVar23 = sVar23 + psVar15[-0x280];
    uVar22 = uVar22 + psVar15[-0x27f];
    psVar15 = psVar15 + 10;
    uVar27 = INFINITY;
    uVar28 = INFINITY;
    uVar29 = INFINITY;
    uVar30 = INFINITY;
    fVar26 = -INFINITY;
    uVar31 = 0xff800000;
    uVar32 = 0xff800000;
    uVar33 = 0xff800000;
    fVar35 = INFINITY;
    fVar37 = INFINITY;
    fVar39 = INFINITY;
    fVar41 = INFINITY;
    fVar43 = -INFINITY;
    uVar34 = 0xff800000;
    uVar36 = 0xff800000;
    uVar38 = 0xff800000;
  }
  if (sVar23 != 0) {
    uVar14 = *(ulong *)((long)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 3) + 8);
    uVar10 = uVar14;
    if ((uVar14 < uVar22) && (uVar24 = uVar14, uVar10 = uVar22, uVar14 != 0)) {
      for (; uVar10 = uVar24, uVar24 < uVar22; uVar24 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0)) {
      }
    }
    local_2e18 = (ulong *)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 3);
    if (uVar22 < *(ulong *)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 3)) {
      *local_2e18 = uVar22;
    }
    if (uVar14 == uVar10) {
      *local_2e18 = uVar22;
    }
    else {
      pvVar3 = ((RefCount *)(pPVar17->super_ParallelForForState).i0)[4]._vptr_RefCount;
      if (uVar10 == 0) {
        sVar18 = 0;
LAB_005f2085:
        pvVar11 = alignedMalloc(sVar18,0x20);
      }
      else {
        puVar4 = ((RefCount *)(pPVar17->super_ParallelForForState).i0)[2]._vptr_RefCount;
        sVar18 = uVar10 << 5;
        (**(code **)*puVar4)(puVar4,sVar18,0);
        if (sVar18 < 0x1c00000) goto LAB_005f2085;
        pvVar11 = os_malloc(sVar18,(bool *)((long)((RefCount *)
                                                   (pPVar17->super_ParallelForForState).i0 + 2) + 8)
                           );
      }
      ((RefCount *)(pPVar17->super_ParallelForForState).i0)[4]._vptr_RefCount = pvVar11;
      lVar12 = 0x10;
      for (uVar14 = 0; uVar14 < *local_2e18; uVar14 = uVar14 + 1) {
        lVar2 = *(long *)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 4);
        puVar4 = (undefined8 *)((long)pvVar3 + lVar12 + -0x10);
        uVar5 = puVar4[1];
        puVar1 = (undefined8 *)(lVar2 + lVar12 + -0x10);
        *puVar1 = *puVar4;
        puVar1[1] = uVar5;
        uVar5 = ((undefined8 *)((long)pvVar3 + lVar12))[1];
        puVar4 = (undefined8 *)(lVar2 + lVar12);
        *puVar4 = *(undefined8 *)((long)pvVar3 + lVar12);
        puVar4[1] = uVar5;
        lVar12 = lVar12 + 0x20;
      }
      lVar12 = *(long *)((long)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 3) + 8);
      if (pvVar3 != (void *)0x0) {
        if ((ulong)(lVar12 << 5) < 0x1c00000) {
          alignedFree(pvVar3);
        }
        else {
          os_free(pvVar3,lVar12 << 5,
                  *(bool *)((long)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 2) + 8));
        }
      }
      if (lVar12 != 0) {
        puVar4 = ((RefCount *)(pPVar17->super_ParallelForForState).i0)[2]._vptr_RefCount;
        (**(code **)*puVar4)(puVar4,lVar12 * -0x20,1);
      }
      *(ulong *)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 3) = uVar22;
      *(ulong *)((long)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 3) + 8) = uVar10;
    }
    sVar18 = pstate.super_ParallelForForState.taskCount;
    if (uVar22 != 0) {
      local_2c98 = (_func_int **)0x7f8000007f800000;
      uStack_2c90 = (Iterator<embree::SubdivMesh,_false> *)0x7f8000007f800000;
      local_2c88 = 0xff800000ff800000;
      uStack_2c80 = 0xff800000ff800000;
      local_2c78 = 0x7f8000007f800000;
      uStack_2c70 = 0x7f8000007f800000;
      local_2c68 = 0xff800000ff800000;
      sStack_2c60 = 0xff800000ff800000;
      local_2c58 = (undefined1  [16])0x0;
      local_2e08._0_8_ = pPVar17;
      local_2e08._8_8_ = &iter;
      taskCount = pstate.super_ParallelForForState.taskCount;
      local_2df8._0_8_ = &pstate;
      local_2df8._8_8_ = &taskCount;
      uStack_2de0 = (anon_class_16_2_341d598e_conflict1 *)(local_2e08 + 8);
      local_2dd8 = &local_2e21;
      uStack_2dd0 = &local_2d98;
      local_2de8 = (anon_class_1_0_00000001 *)&local_2c98;
      local_2d98.func = (anon_class_48_6_afa08d2e_conflict1 *)local_2e08;
      local_2d90 = (Iterator<embree::SubdivMesh,_false> *)local_2e08._8_8_;
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&pinfo,(context_traits)0x4,CUSTOM_CTX);
      pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
           &local_2df8;
      tbb::detail::d1::
      parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
                (0,sVar18,1,(anon_class_8_1_898bcfc2_conflict7 *)&pinfo3,
                 (task_group_context *)&pinfo);
      cVar7 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&pinfo);
      if (cVar7 == '\0') {
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&pinfo);
        pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
             local_2c98;
        pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
             uStack_2c90;
        pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
             local_2c88;
        pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
             uStack_2c80;
        pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             local_2c78;
        pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             uStack_2c70;
        pinfo3.begin = local_2c58._0_8_;
        pinfo3.end = local_2c58._8_8_;
        psVar15 = &pstate.prefix_state.sums[0].begin;
        uVar27 = (undefined4)local_2c78;
        uVar28 = local_2c78._4_4_;
        uVar29 = (undefined4)uStack_2c70;
        uVar30 = uStack_2c70._4_4_;
        uVar31 = (undefined4)local_2c88;
        uVar32 = local_2c88._4_4_;
        uVar33 = (undefined4)uStack_2c80;
        uVar34 = uStack_2c80._4_4_;
        uVar36 = (float)local_2c98;
        uVar38 = local_2c98._4_4_;
        uVar40 = (float)uStack_2c90;
        uVar42 = uStack_2c90._4_4_;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             local_2c68;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             sStack_2c60;
        for (uVar22 = 0; pPVar17 = local_2e10,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_,
            uVar22 < taskCount; uVar22 = uVar22 + 1) {
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
               psVar15[-0x288];
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
               psVar15[-0x287];
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
               psVar15[-0x286];
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
               psVar15[-0x285];
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
               psVar15[-0x284];
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
               psVar15[-0x283];
          uVar5 = psVar15[-0x282];
          uVar6 = psVar15[-0x281];
          pinfo.begin = psVar15[-0x280];
          pinfo.end = psVar15[-0x27f];
          *(undefined4 *)
           &(((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar15 + -8))->
            super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = uVar36;
          *(undefined4 *)((long)psVar15 + -0x3c) = uVar38;
          *(undefined4 *)(psVar15 + -7) = uVar40;
          *(undefined4 *)((long)psVar15 + -0x34) = uVar42;
          *(undefined4 *)&((Vec3fa *)(psVar15 + -6))->field_0 = uVar31;
          *(undefined4 *)((long)psVar15 + -0x2c) = uVar32;
          *(undefined4 *)(psVar15 + -5) = uVar33;
          *(undefined4 *)((long)psVar15 + -0x24) = uVar34;
          *(undefined4 *)&(((BBox3fa *)(psVar15 + -4))->lower).field_0 = uVar27;
          *(undefined4 *)((long)psVar15 + -0x1c) = uVar28;
          *(undefined4 *)(psVar15 + -3) = uVar29;
          *(undefined4 *)((long)psVar15 + -0x14) = uVar30;
          *(undefined8 *)&((Vec3fa *)(psVar15 + -2))->field_0 =
               pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
          psVar15[-1] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0
                        ._8_8_;
          *psVar15 = pinfo3.begin;
          psVar15[1] = pinfo3.end;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ = uVar5
          ;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ = uVar6
          ;
          build::anon_class_1_0_00000001::operator()
                    ((PrimInfo *)&local_2df8.field_1,&local_2e21,&pinfo3,&pinfo);
          pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
               local_2df8._0_8_;
          pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
               local_2df8._8_8_;
          pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
               local_2de8;
          pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
               uStack_2de0;
          pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
               local_2dd8;
          pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
               uStack_2dd0;
          pinfo3.begin = local_2db8._0_8_;
          pinfo3.end = local_2db8._8_8_;
          psVar15 = psVar15 + 10;
          uVar27 = (float)local_2dd8;
          uVar28 = local_2dd8._4_4_;
          uVar29 = (float)uStack_2dd0;
          uVar30 = uStack_2dd0._4_4_;
          uVar31 = (float)local_2de8;
          uVar32 = local_2de8._4_4_;
          uVar33 = (undefined4)uStack_2de0;
          uVar34 = uStack_2de0._4_4_;
          uVar36 = local_2df8.m128[0];
          uVar38 = local_2df8.m128[1];
          uVar40 = local_2df8.m128[2];
          uVar42 = local_2df8.m128[3];
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
               local_2dc8;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
               uStack_2dc0;
        }
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[1] =
             (float)uVar38;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[0] =
             (float)uVar36;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[3] =
             (float)uVar42;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.m128[2] =
             (float)uVar40;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[1] =
             (float)uVar32;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[0] =
             (float)uVar31;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[3] =
             (float)uVar34;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.m128[2] =
             (float)uVar33;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             (float)uVar28;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             (float)uVar27;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             (float)uVar30;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             (float)uVar29;
        pinfo.begin = 0;
        pinfo.end = pinfo3.end;
        for (iVar8 = 0x1f; 4U >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
        local_2de8 = (anon_class_1_0_00000001 *)(long)iVar8;
        local_2df8._0_8_ = 2;
        local_2df8._8_8_ = &DAT_00000020;
        uStack_2de0 = (anon_class_16_2_341d598e_conflict1 *)0x1;
        local_2dd8 = (anon_class_1_0_00000001 *)0x1;
        uStack_2dd0 = (anon_class_8_1_898bcfc2_conflict7 *)0x3f8000003f800000;
        local_2dc8 = 0x400;
        uStack_2dc0 = 0xffffffffffffffff;
        local_2c98 = &PTR_createLeaf_021e1588;
        settings.maxDepth = 0x20;
        settings.branchingFactor = 2;
        settings.logBlockSize = (size_t)local_2de8;
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0;
        settings.intCost = 1.0;
        settings.singleThreadThreshold = 0x400;
        settings.primrefarrayalloc = 0xffffffffffffffff;
        root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                         ((BVHNBuilderV *)&local_2c98,
                          (FastAllocator *)
                          (*(long *)((RefCount *)(local_2e10->super_ParallelForForState).i0 + 1) +
                          0x78),&virtualprogress.super_BuildProgressMonitor,
                          *(PrimRef **)((RefCount *)(local_2e10->super_ParallelForForState).i0 + 4),
                          &pinfo,settings);
        local_2df8._0_8_ =
             pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
        local_2df8._8_8_ =
             pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
        local_2de8 = (anon_class_1_0_00000001 *)
                     pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
                     _0_8_;
        uStack_2de0 = (anon_class_16_2_341d598e_conflict1 *)
                      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
                      _8_8_;
        local_2dd8 = (anon_class_1_0_00000001 *)
                     pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.
                     _0_8_;
        uStack_2dd0 = (anon_class_8_1_898bcfc2_conflict7 *)
                      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.
                      _8_8_;
        local_2dc8 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
                     _0_8_;
        uStack_2dc0 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
                      _8_8_;
        BVHN<4>::set(*(BVHN<4> **)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 1),
                     (NodeRef)root.ptr,(LBBox3fa *)&local_2df8.field_1,pinfo.end - pinfo.begin);
        fVar26 = (float)(pinfo.end - pinfo.begin) * 0.005;
        uVar22 = (ulong)fVar26;
        ctx = (EVP_PKEY_CTX *)((long)(fVar26 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22);
        BVHN<4>::layoutLargeNodes
                  (*(BVHN<4> **)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 1),
                   (size_t)ctx);
        if ((*(byte *)(*(long *)((long)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 1) + 8
                                ) + 0x238) & 1) == 0) {
          lVar12 = *(long *)((long)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 3) + 8);
          pvVar3 = ((RefCount *)(pPVar17->super_ParallelForForState).i0)[4]._vptr_RefCount;
          if (pvVar3 != (void *)0x0) {
            ctx = (EVP_PKEY_CTX *)(lVar12 << 5);
            if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
              alignedFree(pvVar3);
            }
            else {
              os_free(pvVar3,(size_t)ctx,
                      *(bool *)((long)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 2) + 8)
                     );
            }
          }
          if (lVar12 != 0) {
            puVar4 = ((RefCount *)(pPVar17->super_ParallelForForState).i0)[2]._vptr_RefCount;
            ctx = (EVP_PKEY_CTX *)(lVar12 * -0x20);
            (**(code **)*puVar4)(puVar4,ctx,1);
          }
          *local_2e18 = 0;
          local_2e18[1] = 0;
          local_2e18[2] = 0;
        }
        BVHN<4>::cleanup(*(BVHN<4> **)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 1),ctx)
        ;
        BVHN<4>::postBuild(*(BVHN<4> **)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 1),
                           local_2da0);
        return;
      }
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar13,"task cancelled");
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pBVar21 = *(BVHN<4> **)((RefCount *)(pPVar17->super_ParallelForForState).i0 + 1);
  pPVar17 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
            &pinfo;
LAB_005f237c:
  *(undefined8 *)&((Vec3fa *)(pPVar17->super_ParallelForForState).i0)->field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&((Vec3fa *)(pPVar17->super_ParallelForForState).i0)->field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&((Vec3fa *)(pPVar17->super_ParallelForForState).i0)[1].field_0 =
       0xff800000ff800000;
  *(undefined8 *)((long)&((Vec3fa *)(pPVar17->super_ParallelForForState).i0)[1].field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)((Vec3fa *)(pPVar17->super_ParallelForForState).i0 + 2) = 0x7f8000007f800000;
  *(undefined8 *)((long)((Vec3fa *)(pPVar17->super_ParallelForForState).i0 + 2) + 8) =
       0x7f8000007f800000;
  *(undefined8 *)((Vec3fa *)(pPVar17->super_ParallelForForState).i0 + 3) = 0xff800000ff800000;
  *(undefined8 *)((long)((Vec3fa *)(pPVar17->super_ParallelForForState).i0 + 3) + 8) =
       0xff800000ff800000;
  BVHN<4>::set(pBVar21,(NodeRef)0x8,(LBBox3fa *)pPVar17,0);
  return;
}

Assistant:

void build() 
      {
        /* skip build for empty scene */
        const size_t numPrimitives = scene->getNumPrimitives(SubdivMesh::geom_type,false);
        if (numPrimitives == 0) {
          prims.resize(numPrimitives);
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }
 
        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "SubdivPatch1BuilderSAH");

        //bvh->alloc.reset();
        bvh->alloc.init_estimate(numPrimitives*sizeof(PrimRef));

        auto progress = [&] (size_t dn) { bvh->scene->progressMonitor(double(dn)); };
        auto virtualprogress = BuildProgressMonitorFromClosure(progress);

        ParallelForForPrefixSumState<PrimInfo> pstate;
        
        /* initialize allocator and parallel_for_for_prefix_sum */
        Scene::Iterator<SubdivMesh> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfo pinfo1 = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfo
        { 
          size_t p = 0;
          size_t g = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) {          
            if (!mesh->valid(f)) continue;
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              float level[4]; SubdivPatch1Base::computeEdgeLevels(edge_level,subdiv,level);
              Vec2i grid = SubdivPatch1Base::computeGridSize(level);
              size_t num = getNumEagerLeaves(grid.x,grid.y);
              g+=num;
              p++;
            });
          }
          return PrimInfo(p,g,empty);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo(a.begin+b.begin,a.end+b.end,empty); });
        size_t numSubPatches = pinfo1.begin;
        if (numSubPatches == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        prims.resize(pinfo1.end);
        if (pinfo1.end == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        PrimInfo pinfo3 = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo
        {
          Allocator alloc = bvh->alloc.getCachedAllocator();
          
          PrimInfo s(empty);
          for (size_t f=r.begin(); f!=r.end(); ++f) {
            if (!mesh->valid(f)) continue;
            
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              SubdivPatch1Base patch(unsigned(geomID),unsigned(f),subPatch,mesh,0,uv,edge_level,subdiv,VSIZEX);
              size_t num = createEager(patch,scene,mesh,unsigned(f),alloc,&prims[base.end+s.end]);
              assert(num == getNumEagerLeaves(patch.grid_u_res,patch.grid_v_res));
              for (size_t i=0; i<num; i++)
                s.add_center2(prims[base.end+s.end]);
              s.begin++;
            });
          }
          return s;
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a, b); });

        PrimInfo pinfo(0,pinfo3.end,pinfo3);
        
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& range, Allocator alloc) -> NodeRef {
          assert(range.size() == 1);
          size_t leaf = (size_t) prims[range.begin()].ID();
          return NodeRef(leaf);
        };

        /* settings for BVH build */
        GeneralBVHBuilder::Settings settings;
        settings.logBlockSize = bsr(N);
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0f;
        settings.intCost = 1.0f;
        settings.singleThreadThreshold = DEFAULT_SINGLE_THREAD_THRESHOLD;

        NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,createLeaf,virtualprogress,prims.data(),pinfo,settings);
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));
        
	/* clear temporary data for static geometry */
	if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }